

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

int __thiscall CSnapIDPool::NewID(CSnapIDPool *this)

{
  int iVar1;
  int64 iVar2;
  CSnapIDPool *in_RDI;
  int ID;
  int64 Now;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  uint7 in_stack_ffffffffffffffd0;
  bool bVar3;
  
  iVar2 = time_get();
  while( true ) {
    bVar3 = false;
    if (in_RDI->m_FirstTimed != -1) {
      bVar3 = in_RDI->m_aIDs[in_RDI->m_FirstTimed].m_Timeout < iVar2;
    }
    if (!bVar3) break;
    RemoveFirstTimeout(in_RDI);
  }
  iVar1 = in_RDI->m_FirstFree;
  dbg_assert_imp((char *)(ulong)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                 in_stack_ffffffffffffffc8,(char *)0x10dd3c);
  if (iVar1 != -1) {
    in_RDI->m_FirstFree = (int)in_RDI->m_aIDs[in_RDI->m_FirstFree].m_Next;
    in_RDI->m_aIDs[iVar1].m_State = 1;
    in_RDI->m_Usage = in_RDI->m_Usage + 1;
    in_RDI->m_InUsage = in_RDI->m_InUsage + 1;
  }
  return iVar1;
}

Assistant:

int CSnapIDPool::NewID()
{
	int64 Now = time_get();

	// process timed ids
	while(m_FirstTimed != -1 && m_aIDs[m_FirstTimed].m_Timeout < Now)
		RemoveFirstTimeout();

	int ID = m_FirstFree;
	dbg_assert(ID != -1, "id error");
	if(ID == -1)
		return ID;
	m_FirstFree = m_aIDs[m_FirstFree].m_Next;
	m_aIDs[ID].m_State = 1;
	m_Usage++;
	m_InUsage++;
	return ID;
}